

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O2

gid16 TtfUtil::Cmap310Lookup(void *pCmap310,uint uUnicodeId)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint32 uDiff;
  long lVar5;
  long lVar6;
  
  uVar1 = *(uint *)((long)pCmap310 + 0xc);
  lVar6 = 0;
  do {
    lVar5 = lVar6;
    lVar6 = lVar5 + 0xc;
    if ((ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) *
        0xc + 0xc == lVar6) {
      return 0;
    }
    uVar2 = *(uint *)((long)pCmap310 + lVar5 + 0x10);
    uVar4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8;
  } while ((uUnicodeId < (uVar4 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)) ||
          (uVar2 = *(uint *)((long)pCmap310 + lVar5 + 0x14),
          (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) <
          uUnicodeId));
  uVar3 = *(undefined4 *)((long)pCmap310 + lVar5 + 0x18);
  return ((short)uUnicodeId - (short)uVar4) +
         ((ushort)(byte)((uint)uVar3 >> 0x18) | (ushort)((uint)uVar3 >> 8) & 0xff00);
}

Assistant:

gr::gid16 Cmap310Lookup(const void * pCmap310, unsigned int uUnicodeId)
{
	const Sfnt::CmapSubTableFormat12 * pTable = reinterpret_cast<const Sfnt::CmapSubTableFormat12 *>(pCmap310);

	//uint32 uLength = read(pTable->length); //could use to test for premature end of table
	uint32 ucGroups = read(pTable->num_groups);

	for (unsigned int i = 0; i < ucGroups; i++)
	{
		uint32 uStartCode = read(pTable->group[i].start_char_code);
		uint32 uEndCode = read(pTable->group[i].end_char_code);
		if (uUnicodeId >= uStartCode && uUnicodeId <= uEndCode)
		{
			uint32 uDiff = uUnicodeId - uStartCode;
			uint32 uStartGid = read(pTable->group[i].start_glyph_id);
			return static_cast<gr::gid16>(uStartGid + uDiff);
		}
	}

	return 0;
}